

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat-types.h
# Opt level: O2

Clause * __thiscall SAT::getConfl(SAT *this,Reason *r,Lit p)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  Lit *pLVar2;
  Clause *pCVar3;
  uint uVar4;
  
  pCVar3 = (Clause *)(r->field_0)._a;
  uVar4 = (uint)pCVar3 & 3;
  if (((ulong)pCVar3 & 3) != 0) {
    if (uVar4 == 1) {
      UNRECOVERED_JUMPTABLE = engine.propagators.data[(ulong)pCVar3 >> 0x20]->_vptr_Propagator[5];
      iVar1 = (*UNRECOVERED_JUMPTABLE)
                        (engine.propagators.data[(ulong)pCVar3 >> 0x20],(ulong)(uint)p.x,
                         (ulong)((uint)pCVar3 >> 2),UNRECOVERED_JUMPTABLE);
      return (Clause *)CONCAT44(extraout_var,iVar1);
    }
    pCVar3 = this->short_expl;
    *(uint *)pCVar3 = uVar4 << 8 | (uint)*(byte *)pCVar3;
    uVar4 = *(uint *)&r->field_0;
    pLVar2 = Clause::operator[](pCVar3,1);
    pLVar2->x = uVar4 >> 2;
    if (((ulong)*pCVar3 & 0xffffff00) == 0x300) {
      iVar1 = *(int *)((long)&r->field_0 + 4);
      pLVar2 = Clause::operator[](pCVar3,2);
      pLVar2->x = iVar1;
    }
    pCVar3 = this->short_expl;
  }
  return pCVar3;
}

Assistant:

unsigned int d1() const {
		assert(type() != 0);
		return static_cast<unsigned int>((_a & 0xFFFFFFFF) >> 2);
	}